

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_info.cpp
# Opt level: O2

ostream * CMU462::Collada::operator<<(ostream *os,MaterialInfo *material)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"MaterialInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)&(material->super_Instance).name);
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)&(material->super_Instance).id);
  std::operator<<(poVar1,")");
  poVar1 = std::operator<<(os," [");
  poVar1 = std::operator<<(poVar1," BSDF=");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1," ]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const MaterialInfo& material) {

  os << "MaterialInfo: " << material.name << " (id:" << material.id << ")";

  os << " [" << " BSDF=" << material.bsdf << " ]";

  return os;
}